

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setStructPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,StructReader value,
          BuilderArena *orphanArena,bool canonical)

{
  word *pwVar1;
  BuilderArena *this;
  ulong uVar2;
  SegmentBuilder *pSVar3;
  long lVar4;
  word *pwVar5;
  WirePointer *pWVar6;
  long lVar7;
  uint amount;
  undefined7 in_register_00000081;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  SegmentAnd<capnp::word_*> SVar13;
  AllocateResult AVar14;
  Fault f;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar12;
  
  uVar11 = value.dataSize + 7 >> 3;
  uVar12 = (ulong)uVar11;
  uVar9 = (uint)value.pointerCount;
  if ((int)CONCAT71(in_register_00000081,canonical) != 0) {
    if (((undefined1  [48])value & (undefined1  [48])0x7) != (undefined1  [48])0x0 &&
        value.dataSize != 1) {
      f.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      kj::_::Debug::Fault::init
                (&f,(EVP_PKEY_CTX *)
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    if (value.dataSize == 1) {
      if ((*value.data & 1) == 0) {
        uVar12 = 0;
      }
    }
    else {
      uVar2 = (ulong)(value.dataSize >> 3);
      do {
        uVar12 = uVar2;
        if ((void *)(uVar12 + (long)value.data) <= value.data) break;
        uVar2 = uVar12 - 1;
      } while (*(char *)((long)value.data + (uVar12 - 1)) == '\0');
    }
    uVar11 = (uint)uVar12;
    lVar7 = (ulong)value.pointerCount << 3;
    do {
      lVar10 = lVar7;
      pWVar6 = (WirePointer *)((long)&((value.pointers)->offsetAndKind).value + lVar10);
      if (pWVar6 <= value.pointers) break;
      lVar7 = lVar10 + -8;
    } while (pWVar6[-1].field_1.upper32Bits == 0 && pWVar6[-1].offsetAndKind.value == 0);
    uVar9 = (uint)lVar10 >> 3;
  }
  uVar8 = uVar11 + 7 >> 3;
  amount = uVar8 + (uVar9 & 0xffff);
  if (orphanArena == (BuilderArena *)0x0) {
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      zeroObject(segment,capTable,ref);
    }
    SVar13.value = (word *)ref;
    SVar13.segment = segment;
    if (amount == 0) {
      (ref->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pwVar5 = segment->pos;
      if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
                ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar5)) >> 3 <
          (long)(ulong)amount) {
        pwVar5 = (word *)0x0;
      }
      else {
        segment->pos = pwVar5 + amount;
      }
      SVar13.value = pwVar5;
      if (pwVar5 == (word *)0x0) {
        this = (BuilderArena *)(segment->super_SegmentReader).arena;
        if (0x1ffffffe < amount) {
          allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_48);
        }
        AVar14 = BuilderArena::allocate(this,amount + 1);
        pWVar6 = (WirePointer *)AVar14.words;
        pSVar3 = AVar14.segment;
        (ref->offsetAndKind).value =
             (int)AVar14.words - *(int *)&(pSVar3->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (pSVar3->super_SegmentReader).id.value;
        (pWVar6->offsetAndKind).value = 0;
        SVar13.value = (word *)(pWVar6 + 1);
        SVar13.segment = pSVar3;
        ref = pWVar6;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar5 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    SVar13 = (SegmentAnd<capnp::word_*>)BuilderArena::allocate(orphanArena,amount);
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  pwVar5 = SVar13.value;
  (ref->field_1).structRef.dataSize.value = (unsigned_short)uVar8;
  (ref->field_1).structRef.ptrCount.value = (unsigned_short)uVar9;
  if (value.dataSize == 1) {
    if (uVar11 != 0) {
      *(byte *)&pwVar5->content = *value.data & 1;
    }
  }
  else if (uVar11 != 0) {
    memcpy(pwVar5,value.data,(ulong)uVar11);
  }
  if ((unsigned_short)uVar9 != 0) {
    pWVar6 = (WirePointer *)(pwVar5 + uVar8);
    lVar10 = 8;
    lVar7 = -8;
    do {
      lVar4 = (long)(*(int *)((long)&value.pointers[-1].offsetAndKind.value + lVar10) >> 2);
      if (value.segment == (SegmentReader *)0x0) {
        pwVar5 = (word *)((long)&value.pointers[lVar4].offsetAndKind.value + lVar10);
      }
      else {
        pwVar1 = ((value.segment)->ptr).ptr;
        pwVar5 = pwVar1 + ((value.segment)->ptr).size_;
        if (((long)pwVar1 + (lVar7 - (long)value.pointers) >> 3 <= lVar4) &&
           (lVar4 <= (long)pwVar5 + (lVar7 - (long)value.pointers) >> 3)) {
          pwVar5 = (word *)((long)&value.pointers[lVar4].offsetAndKind.value + lVar10);
        }
      }
      copyPointer(SVar13.segment,capTable,pWVar6,value.segment,value.capTable,
                  (WirePointer *)((long)&value.pointers[-1].offsetAndKind.value + lVar10),pwVar5,
                  value.nestingLimit,(BuilderArena *)0x0,canonical);
      pWVar6 = pWVar6 + 1;
      lVar10 = lVar10 + 8;
      lVar4 = (ulong)((uVar9 & 0xffff) << 3) + lVar7;
      lVar7 = lVar7 + -8;
    } while (lVar4 != 0);
  }
  return SVar13;
}

Assistant:

static SegmentAnd<word*> setStructPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, StructReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto dataSize = roundBitsUpToBytes(value.dataSize);
    auto ptrCount = value.pointerCount;

    if (canonical) {
      // StructReaders should not have bitwidths other than 1, but let's be safe
      KJ_REQUIRE((value.dataSize == ONE * BITS)
                 || (value.dataSize % BITS_PER_BYTE == ZERO * BITS));

      if (value.dataSize == ONE * BITS) {
        // Handle the truncation case where it's a false in a 1-bit struct
        if (!value.getDataField<bool>(ZERO * ELEMENTS)) {
          dataSize = ZERO * BYTES;
        }
      } else {
        // Truncate the data section
        auto data = value.getDataSectionAsBlob();
        auto end = data.end();
        while (end > data.begin() && end[-1] == 0) --end;
        dataSize = intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD);
      }

      // Truncate pointer section
      const WirePointer* ptr = value.pointers + ptrCount;
      while (ptr > value.pointers && ptr[-1].isNull()) --ptr;
      ptrCount = intervalLength(value.pointers, ptr, MAX_STRUCT_POINTER_COUNT);
    }

    auto dataWords = roundBytesUpToWords(dataSize);

    auto totalSize = dataWords + ptrCount * WORDS_PER_POINTER;

    word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
    ref->structRef.set(dataWords, ptrCount);

    if (value.dataSize == ONE * BITS) {
      // Data size could be made 0 by truncation
      if (dataSize != ZERO * BYTES) {
        *reinterpret_cast<char*>(ptr) = value.getDataField<bool>(ZERO * ELEMENTS);
      }
    } else {
      copyMemory(reinterpret_cast<byte*>(ptr),
                 reinterpret_cast<const byte*>(value.data),
                 dataSize);
    }

    WirePointer* pointerSection = reinterpret_cast<WirePointer*>(ptr + dataWords);
    for (auto i: kj::zeroTo(ptrCount)) {
      copyPointer(segment, capTable, pointerSection + i,
                  value.segment, value.capTable, value.pointers + i,
                  value.nestingLimit, nullptr, canonical);
    }

    return { segment, ptr };
  }